

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O0

axbStatus_t op_vec_mdot(axbVec_s *x,size_t num_vecs,axbVec_s **y,axbScalar_s **mdot,void *aux_data)

{
  double dVar1;
  void *pvVar2;
  ulong local_88;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  double m [4];
  double val_x;
  double *d_x;
  void *aux_data_local;
  axbScalar_s **mdot_local;
  axbVec_s **y_local;
  size_t num_vecs_local;
  axbVec_s *x_local;
  
  pvVar2 = x->data;
  memset(&i,0,0x20);
  aux_data_local = mdot;
  mdot_local = (axbScalar_s **)y;
  y_local = (axbVec_s **)num_vecs;
  while (y_local != (axbVec_s **)0x0) {
    m[2] = 0.0;
    m[1] = 0.0;
    m[0] = 0.0;
    i = 0;
    if (y_local == (axbVec_s **)0x1) {
      for (i_3 = 0; i_3 < x->size; i_3 = i_3 + 1) {
        i = (size_t)(*(double *)((long)pvVar2 + i_3 * 8) *
                     (double)(&(*mdot_local)->memBackend->name_capacity)[i_3] + (double)i);
      }
      **(size_t **)(*aux_data_local + 0x28) = i;
      y_local = (axbVec_s **)0x0;
    }
    else if (y_local == (axbVec_s **)0x2) {
      for (i_2 = 0; i_2 < x->size; i_2 = i_2 + 1) {
        dVar1 = *(double *)((long)pvVar2 + i_2 * 8);
        i = (size_t)(dVar1 * (double)(&(*mdot_local)->memBackend->name_capacity)[i_2] + (double)i);
        m[0] = dVar1 * (double)(&mdot_local[1]->memBackend->name_capacity)[i_2] + m[0];
      }
      **(size_t **)(*aux_data_local + 0x28) = i;
      **(double **)(*(long *)((long)aux_data_local + 8) + 0x28) = m[0];
      y_local = (axbVec_s **)0x0;
    }
    else if (y_local == (axbVec_s **)0x3) {
      for (i_1 = 0; i_1 < x->size; i_1 = i_1 + 1) {
        dVar1 = *(double *)((long)pvVar2 + i_1 * 8);
        i = (size_t)(dVar1 * (double)(&(*mdot_local)->memBackend->name_capacity)[i_1] + (double)i);
        m[0] = dVar1 * (double)(&mdot_local[1]->memBackend->name_capacity)[i_1] + m[0];
        m[1] = dVar1 * (double)(&mdot_local[2]->memBackend->name_capacity)[i_1] + m[1];
      }
      **(size_t **)(*aux_data_local + 0x28) = i;
      **(double **)(*(long *)((long)aux_data_local + 8) + 0x28) = m[0];
      **(double **)(*(long *)((long)aux_data_local + 0x10) + 0x28) = m[1];
      y_local = (axbVec_s **)0x0;
    }
    else {
      for (local_88 = 0; local_88 < x->size; local_88 = local_88 + 1) {
        dVar1 = *(double *)((long)pvVar2 + local_88 * 8);
        i = (size_t)(dVar1 * (double)(&(*mdot_local)->memBackend->name_capacity)[local_88] +
                    (double)i);
        m[0] = dVar1 * (double)(&mdot_local[1]->memBackend->name_capacity)[local_88] + m[0];
        m[1] = dVar1 * (double)(&mdot_local[2]->memBackend->name_capacity)[local_88] + m[1];
        m[2] = dVar1 * (double)(&mdot_local[3]->memBackend->name_capacity)[local_88] + m[2];
      }
      **(size_t **)(*aux_data_local + 0x28) = i;
      **(double **)(*(long *)((long)aux_data_local + 8) + 0x28) = m[0];
      **(double **)(*(long *)((long)aux_data_local + 0x10) + 0x28) = m[1];
      **(double **)(*(long *)((long)aux_data_local + 0x18) + 0x28) = m[2];
      mdot_local = mdot_local + 4;
      aux_data_local = (void *)((long)aux_data_local + 0x20);
      y_local = (axbVec_s **)((long)y_local + -4);
    }
  }
  return 0;
}

Assistant:

static axbStatus_t op_vec_mdot(const struct axbVec_s *x, size_t num_vecs, const struct axbVec_s **y, struct axbScalar_s **mdot, void *aux_data)
{
  (void)aux_data;

  const double *d_x = x->data;
  double val_x = 0;

  // auxiliary variables
  double m[4] = {0};

  while (num_vecs) {
    m[0] = m[1] = m[2] = m[3] = 0;

    // 'unrolling' for up to four right hand sides y simultaneously.
    // This leverages most of the performance benefits by reducing memory transfers.
    // Further optimizations by unrolling up to 8 vectors are possible.
    // Unrolling to 9+ vectors results in diminishing returns (<10 percent gain)
    switch (num_vecs) {
    case 3:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
        m[2] += val_x * ((const double*)y[2]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];
      *((double*)mdot[2]->data) = m[2];

      num_vecs = 0;
      break;
    case 2:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];

      num_vecs = 0;
      break;
    case 1:
      for (size_t i=0; i<x->size; ++i) {
        m[0] += d_x[i] * ((const double*)y[0]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];

      num_vecs = 0;
      break;
    default:
      for (size_t i=0; i<x->size; ++i) {
        val_x = d_x[i];
        m[0] += val_x * ((const double*)y[0]->data)[i];
        m[1] += val_x * ((const double*)y[1]->data)[i];
        m[2] += val_x * ((const double*)y[2]->data)[i];
        m[3] += val_x * ((const double*)y[3]->data)[i];
      }
      *((double*)mdot[0]->data) = m[0];
      *((double*)mdot[1]->data) = m[1];
      *((double*)mdot[2]->data) = m[2];
      *((double*)mdot[3]->data) = m[3];

      y += 4;
      mdot += 4;
      num_vecs -= 4;
      break;
    }
  } // while

  return 0;
}